

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::read_stats(IxgbeDevice *this,device_stats *stats)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = get_reg32(this,0x4074);
  stats->rx_pkts = stats->rx_pkts + (ulong)uVar1;
  uVar1 = get_reg32(this,0x4080);
  stats->tx_pkts = stats->tx_pkts + (ulong)uVar1;
  uVar1 = get_reg32(this,0x4088);
  uVar2 = get_reg32(this,0x408c);
  stats->rx_bytes = (ulong)uVar1 + stats->rx_bytes + ((ulong)uVar2 << 0x20);
  uVar1 = get_reg32(this,0x4090);
  uVar2 = get_reg32(this,0x4094);
  stats->tx_bytes = (ulong)uVar1 + stats->tx_bytes + ((ulong)uVar2 << 0x20);
  return;
}

Assistant:

void IxgbeDevice::read_stats(struct device_stats &stats) {
    stats.dev = *this;
    stats.rx_pkts += get_reg32(IXGBE_GPRC);
    stats.tx_pkts += get_reg32(IXGBE_GPTC);
    stats.rx_bytes += get_reg32(IXGBE_GORCL) + ((static_cast<uint64_t>(get_reg32(IXGBE_GORCH))) << 32u);
    stats.tx_bytes += get_reg32(IXGBE_GOTCL) + ((static_cast<uint64_t>(get_reg32(IXGBE_GOTCH))) << 32u);
}